

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run<lest::test[2]>(test (*specification) [2],texts *args,ostream *os)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  tests local_50;
  vector<lest::test,_std::allocator<lest::test>_> local_38;
  ostream *local_20;
  ostream *os_local;
  texts *args_local;
  test (*specification_local) [2];
  
  local_20 = os;
  os_local = (ostream *)args;
  args_local = (texts *)specification;
  make_tests<lest::test[2]>(&local_50,specification);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_38,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,args);
  iVar1 = run(&local_38,&local_78,local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_50);
  return iVar1;
}

Assistant:

int run(  C const & specification, texts args, std::ostream & os = std::cout )
{
    return run( make_tests( specification ), args, os  );
}